

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O1

void __thiscall Kernel::InferenceStore::ProofPrinter::print(ProofPrinter *this)

{
  Unit **ppUVar1;
  
  ppUVar1 = (this->outKernel)._cursor;
  if (ppUVar1 != (this->outKernel)._stack) {
    do {
      (this->outKernel)._cursor = ppUVar1 + -1;
      handleStep(this,ppUVar1[-1]);
      ppUVar1 = (this->outKernel)._cursor;
    } while (ppUVar1 != (this->outKernel)._stack);
  }
  if (this->delayPrinting == true) {
    printDelayed(this);
    return;
  }
  return;
}

Assistant:

virtual void print()
  {
    while(outKernel.isNonEmpty()) {
      Unit* cs=outKernel.pop();
      handleStep(cs);
    }
    if(delayPrinting) printDelayed();
  }